

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  StringRef *this_00;
  ulong uVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t Index;
  char *pcVar8;
  bool bVar9;
  StringRef Chars;
  
  uVar1 = (this->Path).Length;
  if (uVar1 <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                  ,0x102,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  this_00 = &this->Component;
  uVar7 = (this->Component).Length;
  uVar6 = this->Position + uVar7;
  this->Position = uVar6;
  if (uVar6 == uVar1) {
    this_00->Data = (char *)0x0;
    (this->Component).Length = 0;
    return this;
  }
  if (uVar7 < 3) {
LAB_00148eaa:
    bVar9 = false;
  }
  else {
    cVar2 = StringRef::operator[](this_00,0);
    if (cVar2 == '/') {
LAB_00148e78:
      cVar2 = StringRef::operator[](this_00,1);
      bVar9 = false;
      cVar3 = StringRef::operator[](this_00,0);
      if (cVar2 == cVar3) {
        cVar2 = StringRef::operator[](this_00,2);
        if (cVar2 == '/') goto LAB_00148eaa;
        bVar9 = cVar2 != '\\' || this->S != windows;
      }
    }
    else {
      bVar9 = false;
      if ((cVar2 == '\\') && (bVar9 = false, this->S == windows)) goto LAB_00148e78;
    }
  }
  cVar2 = StringRef::operator[](&this->Path,this->Position);
  if (cVar2 == '/') {
    if (bVar9) goto LAB_00148ef1;
    if (this->S == windows) goto LAB_00148ede;
  }
  else {
    if (cVar2 != '\\' || this->S != windows) {
      sVar4 = this->Position;
      goto LAB_00148f75;
    }
    if (bVar9) goto LAB_00148ef1;
LAB_00148ede:
    sVar4 = (this->Component).Length;
    if ((sVar4 != 0) && (this_00->Data[sVar4 - 1] == ':')) {
LAB_00148ef1:
      uVar1 = (this->Path).Length;
      uVar7 = this->Position;
      uVar6 = uVar7;
      if (uVar1 < uVar7) {
        uVar6 = uVar1;
      }
      sVar4 = 1;
      if (uVar1 <= uVar7) {
        sVar4 = uVar1 - uVar6;
      }
      (this->Component).Data = (this->Path).Data + uVar6;
      (this->Component).Length = sVar4;
      return this;
    }
  }
  Index = this->Position;
  while (Index != (this->Path).Length) {
    cVar2 = StringRef::operator[](&this->Path,Index);
    if ((cVar2 != '/') && ((cVar2 != '\\' || (this->S != windows)))) {
      Index = (this->Path).Length;
      sVar4 = this->Position;
      if (sVar4 != Index) goto LAB_00148f75;
      break;
    }
    Index = this->Position + 1;
    this->Position = Index;
  }
  sVar4 = Index;
  if (((this->Component).Length != 1) || (*this_00->Data != '/')) {
    this->Position = sVar4 - 1;
    (this->Component).Data = ".";
    (this->Component).Length = 1;
    return this;
  }
LAB_00148f75:
  bVar9 = this->S == windows;
  pcVar8 = "/";
  if (bVar9) {
    pcVar8 = "\\/";
  }
  Chars.Length = (ulong)bVar9 + 1;
  Chars.Data = pcVar8;
  sVar5 = StringRef::find_first_of(&this->Path,Chars,sVar4);
  uVar1 = (this->Path).Length;
  uVar7 = this->Position;
  if (uVar1 < this->Position) {
    uVar7 = uVar1;
  }
  uVar6 = sVar5;
  if (sVar5 < uVar7) {
    uVar6 = uVar7;
  }
  if (uVar1 < sVar5) {
    uVar6 = uVar1;
  }
  (this->Component).Data = (this->Path).Data + uVar7;
  (this->Component).Length = uVar6 - uVar7;
  return this;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }